

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_union_type_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser,
                 flatcc_json_parser_is_known_type_f *accept_type)

{
  char *pcVar1;
  flatbuffers_voffset_t id_00;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  void *pvVar4;
  uint8_t *puVar5;
  char *buf_00;
  size_t sVar6;
  void *__src;
  flatcc_builder_ref_t *pfVar7;
  long lVar8;
  undefined6 in_register_00000082;
  uint8_t uVar9;
  char *pcVar10;
  uint64_t value;
  uint8_t local_5d;
  int local_5c;
  size_t local_58;
  uint local_50;
  int local_4c;
  long local_48;
  uint64_t local_40;
  size_t local_38;
  
  pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  local_48 = union_index * 5;
  if (*(char *)((long)pvVar4 + union_index * 0x28 + 0x24) != '\0') {
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x1c;
    goto LAB_00118359;
  }
  local_50 = (uint)CONCAT62(in_register_00000082,id);
  lVar8 = (long)pvVar4 + union_index * 0x28 + 0x10;
  *(undefined1 *)((long)pvVar4 + union_index * 0x28 + 0x24) = 1;
  iVar2 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
  if (iVar2 == 0) {
    local_58 = lVar8;
    local_38 = handle;
    if ((buf == end) || (*buf != '[')) {
      buf_00 = end;
      if (ctx->error == 0) {
        ctx->error = 0x16;
        ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = buf;
      }
    }
    else {
      pcVar10 = buf + 1;
      if ((long)end - (long)pcVar10 < 2) {
LAB_00118094:
        pcVar10 = flatcc_json_parser_space_ext(ctx,pcVar10,end);
      }
      else if (*pcVar10 < '!') {
        if ((*pcVar10 != ' ') || (buf[2] < '!')) goto LAB_00118094;
        pcVar10 = buf + 2;
      }
      if ((pcVar10 == end) || (*pcVar10 != ']')) {
        local_4c = 1;
        buf_00 = pcVar10;
        do {
          puVar5 = (uint8_t *)flatcc_builder_extend_vector(ctx->ctx,1);
          buf = buf_00;
          if (puVar5 == (uint8_t *)0x0) goto LAB_0011834a;
          local_40 = 0;
          local_5c = 0;
          local_5d = '\0';
          if ((buf_00 != end) &&
             (pcVar10 = flatcc_json_parser_integer(ctx,buf_00,end,&local_5c,&local_40),
             buf = pcVar10, pcVar10 != buf_00)) {
            buf = end;
            if (local_5c == 0) {
              if (local_40 < 0x100) {
                local_5d = (uint8_t)local_40;
                buf = pcVar10;
              }
              else if (ctx->error == 0) {
                ctx->error = 7;
                goto LAB_00118174;
              }
            }
            else if (ctx->error == 0) {
              ctx->error = 8;
LAB_00118174:
              ctx->pos = ((int)pcVar10 - *(int *)&ctx->line_start) + 1;
              ctx->error_loc = pcVar10;
            }
          }
          if ((buf_00 == buf) &&
             ((buf = flatcc_json_parser_symbolic_uint8(ctx,buf,end,type_parsers,&local_5d),
              buf == buf_00 || (buf == end)))) goto LAB_0011834a;
          uVar9 = local_5d;
          iVar2 = (*accept_type)(local_5d);
          if (iVar2 == 0) {
            if ((ctx->flags & 1) == 0) {
              if (ctx->error != 0) {
                return end;
              }
              ctx->error = 0xf;
              goto LAB_00118359;
            }
            local_5d = '\0';
            uVar9 = '\0';
          }
          *puVar5 = uVar9;
          buf_00 = flatcc_json_parser_array_end(ctx,buf,end,&local_4c);
        } while (local_4c != 0);
      }
      else {
        buf_00 = pcVar10 + 1;
        if ((long)end - (long)buf_00 < 2) {
LAB_00118234:
          buf_00 = flatcc_json_parser_space_ext(ctx,buf_00,end);
        }
        else if (*buf_00 < '!') {
          if ((*buf_00 != ' ') || (pcVar10[2] < '!')) goto LAB_00118234;
          buf_00 = pcVar10 + 2;
        }
      }
    }
    sVar6 = flatcc_builder_vector_count(ctx->ctx);
    *(flatbuffers_uoffset_t *)(local_58 + 0x18) = (flatbuffers_uoffset_t)sVar6;
    local_58 = flatcc_builder_enter_user_frame(ctx->ctx,sVar6 & 0xffffffff);
    pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,local_58);
    __src = flatcc_builder_vector_edit(ctx->ctx);
    memcpy(pvVar4,__src,sVar6 & 0xffffffff);
    fVar3 = flatcc_builder_end_vector(ctx->ctx);
    buf = buf_00;
    if (fVar3 != 0) {
      id_00 = (flatbuffers_voffset_t)local_50;
      pfVar7 = flatcc_builder_table_add_offset(ctx->ctx,(local_50 & 0xffff) - 1);
      if (pfVar7 != (flatcc_builder_ref_t *)0x0) {
        *pfVar7 = fVar3;
        pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,local_38);
        *(size_t *)((long)pvVar4 + local_48 * 8 + 0x30) = local_58;
        pcVar10 = *(char **)((long)pvVar4 + local_48 * 8 + 0x10);
        lVar8 = *(long *)((long)pvVar4 + 8);
        if (pcVar10 == (char *)0x0) {
          *(long *)((long)pvVar4 + 8) = lVar8 + 1;
          return buf_00;
        }
        if (lVar8 != 0) {
          *(long *)((long)pvVar4 + 8) = lVar8 + -1;
          iVar2 = ctx->line;
          pcVar1 = ctx->line_start;
          ctx->line = *(int *)((long)pvVar4 + local_48 * 8 + 0x20);
          ctx->line_start = *(char **)((long)pvVar4 + local_48 * 8 + 0x18);
          pcVar10 = _parse_union_vector(ctx,pcVar10,end,local_58,(flatbuffers_uoffset_t)sVar6,id_00,
                                        union_parser);
          if (pcVar10 == end) {
            return end;
          }
          ctx->line = iVar2;
          ctx->line_start = pcVar1;
          return buf_00;
        }
        __assert_fail("f->union_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                      ,0x4d8,
                      "const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *, flatcc_json_parser_is_known_type_f *)"
                     );
      }
    }
  }
LAB_0011834a:
  if (ctx->error != 0) {
    return end;
  }
  ctx->error = 0x23;
LAB_00118359:
  ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = buf;
  return end;
}

Assistant:

const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser,
        flatcc_json_parser_is_known_type_f accept_type)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    const char *mark;
    int line;
    const char *line_start;
    int more;
    utype_t val;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    utype_t *types;
    size_t size;
    size_t h_types;
    uoffset_t count;

#if FLATBUFFERS_UTYPE_MAX != UINT8_MAX
#error "Update union vector parser to support current union type definition."
#endif

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) goto failed;
    buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
    while (more) {
        if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
        buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &val);
        if (mark == buf) {
            buf = flatcc_json_parser_symbolic_uint8(ctx, (mark = buf), end, type_parsers, &val);
            if (buf == mark || buf == end) goto failed;
        }
        /* Parse unknown types as NONE */
        if (!accept_type(val)) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
            }
            val = 0;
        }
        flatbuffers_uint8_write_to_pe(pval, val);
        buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
    }
    count = (uoffset_t)flatcc_builder_vector_count(ctx->ctx);
    e->count = count;
    size = count * utype_size;
    /* Store type vector so it is accessible to the table vector parser.  */
    h_types = flatcc_builder_enter_user_frame(ctx->ctx, size);
    types = flatcc_builder_get_user_frame_ptr(ctx->ctx, h_types);
    memcpy(types, flatcc_builder_vector_edit(ctx->ctx), size);
    if (!((ref = flatcc_builder_end_vector(ctx->ctx)))) goto failed;
    if (!(pref = flatcc_builder_table_add_offset(ctx->ctx, id - 1))) goto failed;
    *pref = ref;

    /* Restore union frame after possible invalidation due to types frame allocation. */
    f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    e = f->unions + union_index;

    e->h_types = h_types;
    if (e->backtrace == 0) {
        ++f->union_count;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    /* We must not assign buf here because we are backtracking. */
    if (end == _parse_union_vector(ctx, e->backtrace, end, h_types, count, id, union_parser)) return end;
    /*
     * NOTE: We do not need the user frame anymore, but if we did, it
     * would have to be restored from its handle due to the above parse.
     */
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}